

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon.cc
# Opt level: O2

void gimage::extractLines
               (vector<gimage::Polygon,_std::allocator<gimage::Polygon>_> *pl,ImageU8 *image,int c,
               int min_size,bool closed,float tolerance)

{
  bool bVar1;
  size_t __n;
  long sy;
  long sx;
  Polygon p;
  ImageU8 mask;
  
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::Image
            (&mask,image->width,image->height,1);
  __n = -mask.n;
  if (0 < mask.n) {
    __n = mask.n;
  }
  sy = 0;
  memset(mask.pixel,0,__n);
  do {
    if (image->height <= sy) {
      Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::~Image(&mask);
      return;
    }
    for (sx = 0; sx < image->width; sx = sx + 1) {
      p.vertex.
      super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      p.vertex.
      super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0x0;
      p.vertex.
      super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (((uint)(*image->img)[sy][sx] == c) && ((*mask.img)[sy][sx] == '\0')) {
        extractContour(&p,&mask,image,sx,sy,0);
        if (min_size <=
            (int)((ulong)((long)p.vertex.
                                super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)p.vertex.
                               super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4)) {
          if (closed) {
            bVar1 = Polygon::isClosed(&p,1.5);
            if (!bVar1) goto LAB_00141d0e;
          }
          if (0.0 <= tolerance) {
            Polygon::reduce(&p,tolerance);
          }
          std::vector<gimage::Polygon,_std::allocator<gimage::Polygon>_>::push_back
                    (pl,(value_type *)&p);
        }
      }
LAB_00141d0e:
      std::_Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>::
      ~_Vector_base((_Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>
                     *)&p);
    }
    sy = sy + 1;
  } while( true );
}

Assistant:

void extractLines(std::vector<Polygon> &pl, const ImageU8 &image, int c, int min_size, bool closed,
  float tolerance)
{
  ImageU8 mask(image.getWidth(), image.getHeight(), 1);
  mask.clear();

  for (long y=0; y<image.getHeight(); y++)
  {
    for (long x=0; x<image.getWidth(); x++)
    {
      Polygon p;

      if (image.get(x, y) == c && mask.get(x, y) == 0)
      {
        extractContour(p, mask, image, x, y, 0);

        if (p.count() >= min_size)
        {
          if (!closed || p.isClosed())
          {
            if (tolerance >= 0)
            {
              p.reduce(tolerance);
            }

            pl.push_back(p);
          }
        }
      }
    }
  }
}